

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ShaderCommonFunctionTests::init
          (ShaderCommonFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  DataType baseType;
  DataType baseType_00;
  TestNode *pTVar2;
  TestNode *pTVar3;
  ulong extraout_RAX;
  TestNode *pTVar5;
  ulong extraout_RAX_00;
  long lVar6;
  int iVar7;
  uint vecSize;
  int shaderType;
  ShaderType SVar8;
  int prec;
  Precision PVar9;
  ulong uVar4;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"abs","abs");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar6 = 0;
  do {
    if (lVar6 != 2) {
      if (lVar6 == 3) {
        pTVar2 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar2,
                   (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sign",
                   "sign");
        tcu::TestNode::addChild((TestNode *)this,pTVar2);
        lVar6 = 0;
        do {
          if (lVar6 != 2) {
            if (lVar6 == 3) {
              pTVar2 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar2,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "floor","floor");
              tcu::TestNode::addChild((TestNode *)this,pTVar2);
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                if (1 < (int)lVar6 - 1U) {
                  iVar1 = (&DAT_01864fe8)[lVar6];
                  for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                    for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                        PVar9 = PVar9 + PRECISION_MEDIUMP) {
                      for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                          SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                        pTVar3 = (TestNode *)operator_new(0x280);
                        FloorCase::FloorCase
                                  ((FloorCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                   iVar1 + -1 + iVar7,PVar9,SVar8);
                        tcu::TestNode::addChild(pTVar2,pTVar3);
                      }
                    }
                  }
                }
              }
              pTVar2 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar2,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "trunc","trunc");
              tcu::TestNode::addChild((TestNode *)this,pTVar2);
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                if (1 < (int)lVar6 - 1U) {
                  iVar1 = (&DAT_01864fe8)[lVar6];
                  for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                    for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                        PVar9 = PVar9 + PRECISION_MEDIUMP) {
                      for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                          SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                        pTVar3 = (TestNode *)operator_new(0x280);
                        TruncCase::TruncCase
                                  ((TruncCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                   iVar1 + -1 + iVar7,PVar9,SVar8);
                        tcu::TestNode::addChild(pTVar2,pTVar3);
                      }
                    }
                  }
                }
              }
              pTVar2 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar2,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "round","round");
              tcu::TestNode::addChild((TestNode *)this,pTVar2);
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                if (1 < (int)lVar6 - 1U) {
                  iVar1 = (&DAT_01864fe8)[lVar6];
                  for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                    for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                        PVar9 = PVar9 + PRECISION_MEDIUMP) {
                      for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                          SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                        pTVar3 = (TestNode *)operator_new(0x280);
                        RoundCase::RoundCase
                                  ((RoundCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                   iVar1 + -1 + iVar7,PVar9,SVar8);
                        tcu::TestNode::addChild(pTVar2,pTVar3);
                      }
                    }
                  }
                }
              }
              pTVar2 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar2,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "roundeven","roundeven");
              tcu::TestNode::addChild((TestNode *)this,pTVar2);
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                if (1 < (int)lVar6 - 1U) {
                  iVar1 = (&DAT_01864fe8)[lVar6];
                  for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                    for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                        PVar9 = PVar9 + PRECISION_MEDIUMP) {
                      for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                          SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                        pTVar3 = (TestNode *)operator_new(0x280);
                        RoundEvenCase::RoundEvenCase
                                  ((RoundEvenCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                   iVar1 + -1 + iVar7,PVar9,SVar8);
                        tcu::TestNode::addChild(pTVar2,pTVar3);
                      }
                    }
                  }
                }
              }
              pTVar2 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar2,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "ceil","ceil");
              tcu::TestNode::addChild((TestNode *)this,pTVar2);
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                if (1 < (int)lVar6 - 1U) {
                  iVar1 = (&DAT_01864fe8)[lVar6];
                  for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                    for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                        PVar9 = PVar9 + PRECISION_MEDIUMP) {
                      for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                          SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                        pTVar3 = (TestNode *)operator_new(0x280);
                        CeilCase::CeilCase((CeilCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                           iVar1 + -1 + iVar7,PVar9,SVar8);
                        tcu::TestNode::addChild(pTVar2,pTVar3);
                      }
                    }
                  }
                }
              }
              pTVar2 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar2,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "fract","fract");
              tcu::TestNode::addChild((TestNode *)this,pTVar2);
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                if (1 < (int)lVar6 - 1U) {
                  iVar1 = (&DAT_01864fe8)[lVar6];
                  for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                    for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                        PVar9 = PVar9 + PRECISION_MEDIUMP) {
                      for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                          SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                        pTVar3 = (TestNode *)operator_new(0x280);
                        FractCase::FractCase
                                  ((FractCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                   iVar1 + -1 + iVar7,PVar9,SVar8);
                        tcu::TestNode::addChild(pTVar2,pTVar3);
                      }
                    }
                  }
                }
              }
              pTVar2 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar2,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "modf","modf");
              tcu::TestNode::addChild((TestNode *)this,pTVar2);
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                if (1 < (int)lVar6 - 1U) {
                  iVar1 = (&DAT_01864fe8)[lVar6];
                  for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                    for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                        PVar9 = PVar9 + PRECISION_MEDIUMP) {
                      for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                          SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                        pTVar3 = (TestNode *)operator_new(0x280);
                        ModfCase::ModfCase((ModfCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                           iVar1 + -1 + iVar7,PVar9,SVar8);
                        tcu::TestNode::addChild(pTVar2,pTVar3);
                      }
                    }
                  }
                }
              }
              pTVar2 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar2,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "isnan","isnan");
              tcu::TestNode::addChild((TestNode *)this,pTVar2);
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                if (1 < (int)lVar6 - 1U) {
                  iVar1 = (&DAT_01864fe8)[lVar6];
                  for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                    for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                        PVar9 = PVar9 + PRECISION_MEDIUMP) {
                      for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                          SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                        pTVar3 = (TestNode *)operator_new(0x280);
                        IsnanCase::IsnanCase
                                  ((IsnanCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                   iVar1 + -1 + iVar7,PVar9,SVar8);
                        tcu::TestNode::addChild(pTVar2,pTVar3);
                      }
                    }
                  }
                }
              }
              pTVar2 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar2,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "isinf","isinf");
              tcu::TestNode::addChild((TestNode *)this,pTVar2);
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                if (1 < (int)lVar6 - 1U) {
                  iVar1 = (&DAT_01864fe8)[lVar6];
                  for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                    for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                        PVar9 = PVar9 + PRECISION_MEDIUMP) {
                      for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                          SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                        pTVar3 = (TestNode *)operator_new(0x280);
                        IsinfCase::IsinfCase
                                  ((IsinfCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                   iVar1 + -1 + iVar7,PVar9,SVar8);
                        tcu::TestNode::addChild(pTVar2,pTVar3);
                      }
                    }
                  }
                }
              }
              pTVar2 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar2,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "floatbitstoint","floatbitstoint");
              tcu::TestNode::addChild((TestNode *)this,pTVar2);
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                if (1 < (int)lVar6 - 1U) {
                  iVar1 = (&DAT_01864fe8)[lVar6];
                  for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                    for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                        PVar9 = PVar9 + PRECISION_MEDIUMP) {
                      for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                          SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                        pTVar3 = (TestNode *)operator_new(0x280);
                        FloatBitsToIntCase::FloatBitsToIntCase
                                  ((FloatBitsToIntCase *)pTVar3,
                                   (this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar7,PVar9,
                                   SVar8);
                        tcu::TestNode::addChild(pTVar2,pTVar3);
                      }
                    }
                  }
                }
              }
              pTVar2 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar2,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "floatbitstouint","floatbitstouint");
              tcu::TestNode::addChild((TestNode *)this,pTVar2);
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                if (1 < (int)lVar6 - 1U) {
                  iVar1 = (&DAT_01864fe8)[lVar6];
                  for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                    for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                        PVar9 = PVar9 + PRECISION_MEDIUMP) {
                      for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                          SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                        pTVar3 = (TestNode *)operator_new(0x280);
                        FloatBitsToUintCase::FloatBitsToUintCase
                                  ((FloatBitsToUintCase *)pTVar3,
                                   (this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar7,PVar9,
                                   SVar8);
                        tcu::TestNode::addChild(pTVar2,pTVar3);
                      }
                    }
                  }
                }
              }
              pTVar2 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar2,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "intbitstofloat","intBitsToFloat() Tests");
              pTVar3 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar3,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "uintbitstofloat","uintBitsToFloat() Tests");
              tcu::TestNode::addChild((TestNode *)this,pTVar2);
              tcu::TestNode::addChild((TestNode *)this,pTVar3);
              uVar4 = extraout_RAX;
              for (vecSize = 1; vecSize != 4; vecSize = vecSize + 1) {
                baseType = TYPE_INT;
                baseType_00 = TYPE_UINT;
                if (1 < vecSize) {
                  baseType = glu::getDataTypeIntVec(vecSize);
                  baseType_00 = glu::getDataTypeUintVec(vecSize);
                  uVar4 = (ulong)baseType_00;
                }
                for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                    SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                  pTVar5 = (TestNode *)operator_new(0x280);
                  BitsToFloatCase::BitsToFloatCase
                            ((BitsToFloatCase *)pTVar5,(this->super_TestCaseGroup).m_context,
                             baseType,SVar8);
                  tcu::TestNode::addChild(pTVar2,pTVar5);
                  pTVar5 = (TestNode *)operator_new(0x280);
                  BitsToFloatCase::BitsToFloatCase
                            ((BitsToFloatCase *)pTVar5,(this->super_TestCaseGroup).m_context,
                             baseType_00,SVar8);
                  tcu::TestNode::addChild(pTVar3,pTVar5);
                  uVar4 = extraout_RAX_00;
                }
              }
              return (int)uVar4;
            }
            iVar1 = (&DAT_01864fe8)[lVar6];
            for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
              for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                  PVar9 = PVar9 + PRECISION_MEDIUMP) {
                for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
                    SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                  pTVar3 = (TestNode *)operator_new(0x280);
                  SignCase::SignCase((SignCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                                     iVar1 + -1 + iVar7,PVar9,SVar8);
                  tcu::TestNode::addChild(pTVar2,pTVar3);
                }
              }
            }
          }
          lVar6 = lVar6 + 1;
        } while( true );
      }
      iVar1 = (&DAT_01864fe8)[lVar6];
      for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
        for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST; PVar9 = PVar9 + PRECISION_MEDIUMP) {
          for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_GEOMETRY;
              SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
            pTVar3 = (TestNode *)operator_new(0x280);
            AbsCase::AbsCase((AbsCase *)pTVar3,(this->super_TestCaseGroup).m_context,
                             iVar1 + -1 + iVar7,PVar9,SVar8);
            tcu::TestNode::addChild(pTVar2,pTVar3);
          }
        }
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void ShaderCommonFunctionTests::init (void)
{
	//																	Float?	Int?	Uint?
	addFunctionCases<AbsCase>				(this,	"abs",				true,	true,	false);
	addFunctionCases<SignCase>				(this,	"sign",				true,	true,	false);
	addFunctionCases<FloorCase>				(this,	"floor",			true,	false,	false);
	addFunctionCases<TruncCase>				(this,	"trunc",			true,	false,	false);
	addFunctionCases<RoundCase>				(this,	"round",			true,	false,	false);
	addFunctionCases<RoundEvenCase>			(this,	"roundeven",		true,	false,	false);
	addFunctionCases<CeilCase>				(this,	"ceil",				true,	false,	false);
	addFunctionCases<FractCase>				(this,	"fract",			true,	false,	false);
	// mod
	addFunctionCases<ModfCase>				(this,	"modf",				true,	false,	false);
	// min
	// max
	// clamp
	// mix
	// step
	// smoothstep
	addFunctionCases<IsnanCase>				(this,	"isnan",			true,	false,	false);
	addFunctionCases<IsinfCase>				(this,	"isinf",			true,	false,	false);
	addFunctionCases<FloatBitsToIntCase>	(this,	"floatbitstoint",	true,	false,	false);
	addFunctionCases<FloatBitsToUintCase>	(this,	"floatbitstouint",	true,	false,	false);

	// (u)intBitsToFloat()
	{
		tcu::TestCaseGroup* intGroup	= new tcu::TestCaseGroup(m_testCtx, "intbitstofloat",	"intBitsToFloat() Tests");
		tcu::TestCaseGroup* uintGroup	= new tcu::TestCaseGroup(m_testCtx, "uintbitstofloat",	"uintBitsToFloat() Tests");

		addChild(intGroup);
		addChild(uintGroup);

		for (int vecSize = 1; vecSize < 4; vecSize++)
		{
			const glu::DataType		intType		= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::DataType		uintType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;

			for (int shaderType = glu::SHADERTYPE_VERTEX; shaderType <= glu::SHADERTYPE_FRAGMENT; shaderType++)
			{
				intGroup->addChild(new BitsToFloatCase(m_context, intType, glu::ShaderType(shaderType)));
				uintGroup->addChild(new BitsToFloatCase(m_context, uintType, glu::ShaderType(shaderType)));
			}
		}
	}
}